

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_hash_map.hpp
# Opt level: O0

void __thiscall
ska::detailv3::
sherwood_v3_table<std::pair<unsigned_long,_unsigned_long>,_unsigned_long,_slang::Hasher<unsigned_long>,_ska::detailv3::KeyOrValueHasher<unsigned_long,_std::pair<unsigned_long,_unsigned_long>,_slang::Hasher<unsigned_long>_>,_std::equal_to<unsigned_long>,_ska::detailv3::KeyOrValueEquality<unsigned_long,_std::pair<unsigned_long,_unsigned_long>,_std::equal_to<unsigned_long>_>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<unsigned_long,_unsigned_long>_>_>_>
::~sherwood_v3_table
          (sherwood_v3_table<std::pair<unsigned_long,_unsigned_long>,_unsigned_long,_slang::Hasher<unsigned_long>,_ska::detailv3::KeyOrValueHasher<unsigned_long,_std::pair<unsigned_long,_unsigned_long>,_slang::Hasher<unsigned_long>_>,_std::equal_to<unsigned_long>,_ska::detailv3::KeyOrValueEquality<unsigned_long,_std::pair<unsigned_long,_unsigned_long>,_std::equal_to<unsigned_long>_>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<unsigned_long,_unsigned_long>_>_>_>
           *this)

{
  sherwood_v3_table<std::pair<unsigned_long,_unsigned_long>,_unsigned_long,_slang::Hasher<unsigned_long>,_ska::detailv3::KeyOrValueHasher<unsigned_long,_std::pair<unsigned_long,_unsigned_long>,_slang::Hasher<unsigned_long>_>,_std::equal_to<unsigned_long>,_ska::detailv3::KeyOrValueEquality<unsigned_long,_std::pair<unsigned_long,_unsigned_long>,_std::equal_to<unsigned_long>_>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<unsigned_long,_unsigned_long>_>_>_>
  *this_local;
  
  clear(this);
  deallocate_data(this,this->entries,this->num_slots_minus_one,this->max_lookups);
  std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<unsigned_long,_unsigned_long>_>_>::
  ~allocator((allocator<ska::detailv3::sherwood_v3_entry<std::pair<unsigned_long,_unsigned_long>_>_>
              *)this);
  return;
}

Assistant:

~sherwood_v3_table()
    {
        clear();
        deallocate_data(entries, num_slots_minus_one, max_lookups);
    }